

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O0

ROOM_AFFECT_DATA * new_affect_room(void)

{
  ROOM_AFFECT_DATA *af;
  ROOM_AFFECT_DATA *local_8;
  
  if (raffect_free == (ROOM_AFFECT_DATA *)0x0) {
    local_8 = (ROOM_AFFECT_DATA *)operator_new(0x50);
  }
  else {
    local_8 = raffect_free;
    raffect_free = raffect_free->next;
  }
  memcpy(local_8,&new_affect_room::af_zero,0x50);
  local_8->valid = true;
  return local_8;
}

Assistant:

ROOM_AFFECT_DATA *new_affect_room(void)
{
	static ROOM_AFFECT_DATA af_zero;
	ROOM_AFFECT_DATA *af;

	if (raffect_free == nullptr)
	{
		af = new ROOM_AFFECT_DATA;
	}
	else
	{
		af = raffect_free;
		raffect_free = raffect_free->next;
	}

	*af = af_zero;

	af->valid = true;
	return af;
}